

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O1

void __thiscall kj::anon_unknown_9::DiskHandle::zero(DiskHandle *this,uint64_t offset,uint64_t size)

{
  int iVar1;
  iovec *piVar2;
  iovec *piVar3;
  size_t sVar4;
  ulong uVar5;
  Fault f_1;
  Array<iovec> iov_heap;
  ssize_t n;
  Fault f;
  iovec iov_stack [16];
  Fault local_1a0;
  iovec *local_198;
  size_t sStack_190;
  undefined8 *local_188;
  ssize_t local_178;
  ulong local_170;
  ssize_t *local_168;
  ulong uStack_160;
  char *local_158;
  undefined8 local_150;
  undefined1 local_148;
  iovec local_138 [16];
  
  do {
    iVar1 = fallocate64((this->fd).fd,3,offset,size);
    if (-1 < iVar1) {
      iVar1 = 0;
      break;
    }
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    if (iVar1 == 0x5f) {
      uVar5 = size + 0xfff >> 0xc;
      sVar4 = 0x400;
      if (uVar5 < 0x400) {
        sVar4 = uVar5;
      }
      if (size + 0xfff < 0x11000) {
        local_198 = (iovec *)0x0;
        sStack_190 = 0;
        local_188 = (undefined8 *)0x0;
        piVar2 = local_138;
      }
      else {
        piVar2 = (iovec *)kj::_::HeapArrayDisposer::allocateImpl
                                    (0x10,sVar4,sVar4,(_func_void_void_ptr *)0x0,
                                     (_func_void_void_ptr *)0x0);
        local_188 = &kj::_::HeapArrayDisposer::instance;
        local_198 = piVar2;
        sStack_190 = sVar4;
      }
      if (sVar4 != 0) {
        piVar3 = piVar2;
        do {
          piVar3->iov_base = "";
          piVar3->iov_len = 0x1000;
          piVar3 = piVar3 + 1;
        } while (piVar3 != piVar2 + sVar4);
      }
      if (size != 0) {
        local_170 = sVar4 << 0xc;
        do {
          if ((size < local_170) && ((size & 0xfff) != 0)) {
            *(uint64_t *)((long)&piVar2->iov_len + (size >> 8 & 0xfffffffffffffff0)) = size & 0xfff;
          }
          do {
            local_178 = pwritev64((this->fd).fd,piVar2,(int)uVar5,offset);
            if (-1 < local_178) {
              iVar1 = 0;
              break;
            }
            iVar1 = kj::_::Debug::getOsErrorNumber(false);
          } while (iVar1 == -1);
          if (iVar1 != 0) {
            local_1a0.exception = (Exception *)0x0;
            local_168 = (ssize_t *)0x0;
            uStack_160 = 0;
            kj::_::Debug::Fault::init
                      (&local_1a0,
                       (EVP_PKEY_CTX *)
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                      );
            kj::_::Debug::Fault::fatal(&local_1a0);
          }
          local_168 = &local_178;
          uStack_160 = uStack_160 & 0xffffffff00000000;
          local_158 = " > ";
          local_150 = 4;
          local_148 = 0 < local_178;
          if (local_178 < 1) {
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<long&,int>&,char_const(&)[24]>
                      (&local_1a0,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                       ,0x1c3,FAILED,"n > 0","_kjCondition,\"pwrite() returned zero?\"",
                       (DebugComparison<long_&,_int> *)&local_168,
                       (char (*) [24])"pwrite() returned zero?");
            kj::_::Debug::Fault::fatal(&local_1a0);
          }
          offset = offset + local_178;
          size = size - local_178;
        } while (size != 0);
      }
      sVar4 = sStack_190;
      piVar2 = local_198;
      if (local_198 != (iovec *)0x0) {
        local_198 = (iovec *)0x0;
        sStack_190 = 0;
        (**(code **)*local_188)(local_188,piVar2,0x10,sVar4,sVar4,0);
      }
    }
    else {
      local_168 = (ssize_t *)0x0;
      local_138[0].iov_base = (void *)0x0;
      local_138[0].iov_len = 0;
      kj::_::Debug::Fault::init
                ((Fault *)&local_168,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                );
      kj::_::Debug::Fault::~Fault((Fault *)&local_168);
    }
  }
  return;
}

Assistant:

void zero(uint64_t offset, uint64_t size) const {
    // If FALLOC_FL_PUNCH_HOLE is defined, use it to efficiently zero the area.
    //
    // A fallocate() wrapper was only added to Android's Bionic C library as of API level 21,
    // but FALLOC_FL_PUNCH_HOLE is apparently defined in the headers before that, so we'll
    // have to explicitly test for that case.
#if defined(FALLOC_FL_PUNCH_HOLE) && !(__ANDROID__ && __BIONIC__ && __ANDROID_API__ < 21)
    KJ_SYSCALL_HANDLE_ERRORS(
        fallocate(fd, FALLOC_FL_PUNCH_HOLE | FALLOC_FL_KEEP_SIZE, offset, size)) {
      case EOPNOTSUPP:
        // fall back to below
        break;
      default:
        KJ_FAIL_SYSCALL("fallocate(FALLOC_FL_PUNCH_HOLE)", error) { return; }
    } else {
      return;
    }
#endif

    static const byte ZEROS[4096] = { 0 };

#if __APPLE__ || __CYGWIN__ || (defined(__ANDROID__) && __ANDROID_API__ < 24)
    // Mac & Cygwin & Android API levels 23 and lower doesn't have pwritev().
    while (size > sizeof(ZEROS)) {
      write(offset, ZEROS);
      size -= sizeof(ZEROS);
      offset += sizeof(ZEROS);
    }
    write(offset, kj::arrayPtr(ZEROS, size));
#else
    // Use a 4k buffer of zeros amplified by iov to write zeros with as few syscalls as possible.
    size_t count = (size + sizeof(ZEROS) - 1) / sizeof(ZEROS);
    const size_t iovmax = miniposix::iovMax();
    KJ_STACK_ARRAY(struct iovec, iov, kj::min(iovmax, count), 16, 256);

    for (auto& item: iov) {
      item.iov_base = const_cast<byte*>(ZEROS);
      item.iov_len = sizeof(ZEROS);
    }

    while (size > 0) {
      size_t iovCount;
      if (size >= iov.size() * sizeof(ZEROS)) {
        iovCount = iov.size();
      } else {
        iovCount = size / sizeof(ZEROS);
        size_t rem = size % sizeof(ZEROS);
        if (rem > 0) {
          iov[iovCount++].iov_len = rem;
        }
      }

      ssize_t n;
      KJ_SYSCALL(n = pwritev(fd, iov.begin(), count, offset));
      KJ_ASSERT(n > 0, "pwrite() returned zero?");

      offset += n;
      size -= n;
    }
#endif
  }